

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

MontgomeryPoint * ecc_montgomery_point_new(MontgomeryCurve *mc,mp_int *x)

{
  MontgomeryPoint *pMVar1;
  mp_int *pmVar2;
  
  pMVar1 = ecc_montgomery_point_new_empty(mc);
  pmVar2 = monty_import(mc->mc,x);
  pMVar1->X = pmVar2;
  pmVar2 = monty_identity(mc->mc);
  pmVar2 = mp_copy(pmVar2);
  pMVar1->Z = pmVar2;
  return pMVar1;
}

Assistant:

MontgomeryPoint *ecc_montgomery_point_new(MontgomeryCurve *mc, mp_int *x)
{
    MontgomeryPoint *mp = ecc_montgomery_point_new_empty(mc);
    mp->X = monty_import(mc->mc, x);
    mp->Z = mp_copy(monty_identity(mc->mc));
    return mp;
}